

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d-dw.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> *
f32_range(vector<float,_std::allocator<float>_> *__return_storage_ptr__,int n,float start,float end)

{
  pointer pfVar1;
  ulong uVar2;
  ulong uVar3;
  allocator_type local_19;
  float local_18;
  float local_14;
  
  local_18 = start;
  local_14 = end;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,(long)n,&local_19);
  pfVar1 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pfVar1[uVar2] = (float)(int)uVar2 * ((local_14 - local_18) / (float)n) + local_18;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> f32_range(int n, float start, float end) {
    std::vector<float> values(n);
    float step = (end - start) / n;
    for (int i = 0; i < n; i++) {
        values[i] = start + i * step;
    }
    return values;
}